

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

void ImageDrawRectangleLines(Image *dst,Rectangle rec,int thick,Color color)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Rectangle rec_00;
  Rectangle rec_01;
  Rectangle rec_02;
  Rectangle rec_03;
  undefined8 local_88;
  
  fVar1 = rec.y;
  fVar3 = (float)(int)rec.x;
  fVar4 = (float)thick;
  rec_00.width = (float)(int)rec.width;
  rec_00.y = (float)(int)fVar1;
  rec_00.x = fVar3;
  rec_00.height = fVar4;
  ImageDrawRectangleRec(dst,rec_00,color);
  fVar2 = (float)(int)(rec.height - (float)(thick * 2));
  rec_01.y = (float)(int)(fVar1 + fVar4);
  rec_01.x = fVar3;
  rec_01.height = fVar2;
  rec_01.width = fVar4;
  ImageDrawRectangleRec(dst,rec_01,color);
  rec_02.height = fVar2;
  rec_02.width = fVar4;
  rec_02.x = (float)(int)((rec.x + rec.width) - fVar4);
  rec_02.y = rec_01.y;
  ImageDrawRectangleRec(dst,rec_02,color);
  rec_03.height = fVar4;
  rec_03.width = rec_00.width;
  rec_03.y = (float)(int)((rec.height + fVar1) - fVar4);
  rec_03.x = fVar3;
  ImageDrawRectangleRec(dst,rec_03,color);
  return;
}

Assistant:

void ImageDrawRectangleLines(Image *dst, Rectangle rec, int thick, Color color)
{
    ImageDrawRectangle(dst, (int)rec.x, (int)rec.y, (int)rec.width, thick, color);
    ImageDrawRectangle(dst, (int)rec.x, (int)(rec.y + thick), thick, (int)(rec.height - thick*2), color);
    ImageDrawRectangle(dst, (int)(rec.x + rec.width - thick), (int)(rec.y + thick), thick, (int)(rec.height - thick*2), color);
    ImageDrawRectangle(dst, (int)rec.x, (int)(rec.y + rec.height - thick), (int)rec.width, thick, color);
}